

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsocketnotifier.cpp
# Opt level: O2

void QSocketNotifier::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  undefined8 *puVar2;
  InterfaceType *pIVar3;
  
  if (_c != RegisterMethodArgumentMetaType) {
    if (_c == IndexOfMethod) {
      bVar1 = QtMocHelpers::
              indexOfMethod<void(QSocketNotifier::*)(QSocketDescriptor,QSocketNotifier::Type,QSocketNotifier::QPrivateSignal)>
                        ((QtMocHelpers *)_a,(void **)activated,0,0);
      if (bVar1) {
        return;
      }
      QtMocHelpers::indexOfMethod<void(QSocketNotifier::*)(int,QSocketNotifier::QPrivateSignal)>
                ((QtMocHelpers *)_a,(void **)activated,0,2);
      return;
    }
    if (_c != InvokeMetaMethod) {
      return;
    }
    switch(_id) {
    case 0:
      activated((QSocketNotifier *)_o,*_a[1],*_a[2]);
      return;
    case 1:
    case 2:
      activated((QSocketNotifier *)_o,*_a[1]);
      return;
    case 3:
      setEnabled((QSocketNotifier *)_o,*_a[1]);
      return;
    default:
      return;
    }
  }
  if (_id == 0) {
    puVar2 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
LAB_0029e51b:
      pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QSocketDescriptor>::metaType;
    }
    else {
      if (*_a[1] != 1) goto LAB_0029e515;
      pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QSocketNotifier::Type>::metaType;
    }
    *puVar2 = pIVar3;
  }
  else {
    if (_id == 1) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) goto LAB_0029e51b;
    }
    else {
      puVar2 = (undefined8 *)*_a;
    }
LAB_0029e515:
    *puVar2 = 0;
  }
  return;
}

Assistant:

void QSocketNotifier::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSocketNotifier *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QSocketDescriptor>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSocketNotifier::Type>>(_a[2])), QPrivateSignal()); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<QSocketDescriptor>>(_a[1])), QPrivateSignal()); break;
        case 2: _t->activated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])), QPrivateSignal()); break;
        case 3: _t->setEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSocketDescriptor >(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSocketNotifier::Type >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSocketDescriptor >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSocketNotifier::*)(QSocketDescriptor , QSocketNotifier::Type , QPrivateSignal)>(_a, &QSocketNotifier::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSocketNotifier::*)(int , QPrivateSignal)>(_a, &QSocketNotifier::activated, 2))
            return;
    }
}